

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_is_valid_var(secp256k1_ge *a)

{
  long in_RDI;
  secp256k1_fe c;
  secp256k1_fe x3;
  secp256k1_fe y2;
  secp256k1_fe *in_stack_ffffffffffffff78;
  secp256k1_fe *in_stack_ffffffffffffff80;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_fe *in_stack_ffffffffffffffa0;
  int local_4;
  
  if (*(int *)(in_RDI + 0x50) == 0) {
    secp256k1_fe_sqr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    secp256k1_fe_sqr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    secp256k1_fe_mul(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(secp256k1_fe *)0x11e308);
    secp256k1_fe_set_int((secp256k1_fe *)&stack0xffffffffffffff78,7);
    secp256k1_fe_add((secp256k1_fe *)&stack0xffffffffffffffa0,
                     (secp256k1_fe *)&stack0xffffffffffffff78);
    secp256k1_fe_normalize_weak((secp256k1_fe *)&stack0xffffffffffffffa0);
    local_4 = secp256k1_fe_equal_var(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ge_is_valid_var(const secp256k1_ge *a) {
    secp256k1_fe y2, x3, c;
    if (a->infinity) {
        return 0;
    }
    /* y^2 = x^3 + 7 */
    secp256k1_fe_sqr(&y2, &a->y);
    secp256k1_fe_sqr(&x3, &a->x); secp256k1_fe_mul(&x3, &x3, &a->x);
    secp256k1_fe_set_int(&c, CURVE_B);
    secp256k1_fe_add(&x3, &c);
    secp256k1_fe_normalize_weak(&x3);
    return secp256k1_fe_equal_var(&y2, &x3);
}